

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFontAtlas::CalcCustomRectUV
          (ImFontAtlas *this,CustomRect *rect,ImVec2 *out_uv_min,ImVec2 *out_uv_max)

{
  bool bVar1;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 *local_28;
  ImVec2 *out_uv_max_local;
  ImVec2 *out_uv_min_local;
  CustomRect *rect_local;
  ImFontAtlas *this_local;
  
  bVar1 = false;
  if (0 < this->TexWidth) {
    bVar1 = 0 < this->TexHeight;
  }
  local_28 = out_uv_max;
  out_uv_max_local = out_uv_min;
  out_uv_min_local = (ImVec2 *)rect;
  rect_local = (CustomRect *)this;
  if (!bVar1) {
    __assert_fail("TexWidth > 0 && TexHeight > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                  ,0x669,
                  "void ImFontAtlas::CalcCustomRectUV(const CustomRect *, ImVec2 *, ImVec2 *)");
  }
  bVar1 = CustomRect::IsPacked(rect);
  if (!bVar1) {
    __assert_fail("rect->IsPacked()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                  ,0x66a,
                  "void ImFontAtlas::CalcCustomRectUV(const CustomRect *, ImVec2 *, ImVec2 *)");
  }
  ImVec2::ImVec2(&local_30,(float)*(ushort *)&out_uv_min_local[1].x * (this->TexUvScale).x,
                 (float)*(ushort *)((long)&out_uv_min_local[1].x + 2) * (this->TexUvScale).y);
  *out_uv_max_local = local_30;
  ImVec2::ImVec2(&local_38,
                 (float)((uint)*(ushort *)&out_uv_min_local[1].x +
                        (uint)*(ushort *)&out_uv_min_local->y) * (this->TexUvScale).x,
                 (float)((uint)*(ushort *)((long)&out_uv_min_local[1].x + 2) +
                        (uint)*(ushort *)((long)&out_uv_min_local->y + 2)) * (this->TexUvScale).y);
  *local_28 = local_38;
  return;
}

Assistant:

void ImFontAtlas::CalcCustomRectUV(const CustomRect* rect, ImVec2* out_uv_min, ImVec2* out_uv_max)
{
    IM_ASSERT(TexWidth > 0 && TexHeight > 0);   // Font atlas needs to be built before we can calculate UV coordinates
    IM_ASSERT(rect->IsPacked());                // Make sure the rectangle has been packed
    *out_uv_min = ImVec2((float)rect->X * TexUvScale.x, (float)rect->Y * TexUvScale.y);
    *out_uv_max = ImVec2((float)(rect->X + rect->Width) * TexUvScale.x, (float)(rect->Y + rect->Height) * TexUvScale.y);
}